

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# touzet_ted_test.cc
# Opt level: O2

int main(void)

{
  char cVar1;
  bool bVar2;
  int k;
  istream *piVar3;
  ostream *poVar4;
  string *psVar5;
  double __val;
  double __val_00;
  int local_d78;
  CostModel ucm;
  string destination_tree;
  string source_tree;
  string line;
  string local_cf8;
  string local_cd8;
  Node<label::StringLabel> t2;
  LabelDictionary ld;
  Node<label::StringLabel> t1;
  TouzetDepthPruningTruncatedTreeFixTreeIndex<cost_model::UnitCostModelLD<label::StringLabel>,_node::TreeIndexAll>
  touzet_algorithm;
  BracketNotationParser<label::StringLabel> bnp;
  ifstream test_cases_file;
  TreeIndexAll ti1;
  TreeIndexAll ti2;
  
  ld.label_to_id_dictionary_._M_h._M_buckets = &ld.label_to_id_dictionary_._M_h._M_single_bucket;
  ld.label_to_id_dictionary_._M_h._M_bucket_count = 1;
  ld.label_to_id_dictionary_._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  ld.label_to_id_dictionary_._M_h._M_element_count = 0;
  ld.label_to_id_dictionary_._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  ld.label_to_id_dictionary_._M_h._M_rehash_policy._M_next_resize = 0;
  ld.label_to_id_dictionary_._M_h._M_single_bucket = (__node_base_ptr)0x0;
  ld.id_to_label_dictionary_.
  super__Vector_base<label::StringLabel,_std::allocator<label::StringLabel>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  ld.id_to_label_dictionary_.
  super__Vector_base<label::StringLabel,_std::allocator<label::StringLabel>_>._M_impl.
  super__Vector_impl_data._M_finish._0_4_ = 0;
  ld.id_to_label_dictionary_.
  super__Vector_base<label::StringLabel,_std::allocator<label::StringLabel>_>._M_impl.
  super__Vector_impl_data._M_finish._4_4_ = 0;
  ld.id_to_label_dictionary_.
  super__Vector_base<label::StringLabel,_std::allocator<label::StringLabel>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage._0_4_ = 0;
  ld._76_8_ = 0;
  ucm.ld_ = &ld;
  std::ifstream::ifstream(&test_cases_file,"touzet_ted_test_data.txt",_S_in);
  cVar1 = std::__basic_file<char>::is_open();
  if (cVar1 == '\0') {
    poVar4 = std::operator<<((ostream *)&std::cerr,"Error while opening file.");
    std::endl<char,std::char_traits<char>>(poVar4);
    local_d78 = -1;
  }
  else {
    touzet_algorithm.
    super_TouzetBaselineTreeIndex<cost_model::UnitCostModelLD<label::StringLabel>,_node::TreeIndexAll>
    .super_TEDAlgorithmTouzet<cost_model::UnitCostModelLD<label::StringLabel>,_node::TreeIndexAll>.
    super_TEDAlgorithm<cost_model::UnitCostModelLD<label::StringLabel>,_node::TreeIndexAll>.c_ =
         &ucm;
    touzet_algorithm.
    super_TouzetBaselineTreeIndex<cost_model::UnitCostModelLD<label::StringLabel>,_node::TreeIndexAll>
    .super_TEDAlgorithmTouzet<cost_model::UnitCostModelLD<label::StringLabel>,_node::TreeIndexAll>.
    td_.super_Matrix<double>.data_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    touzet_algorithm.
    super_TouzetBaselineTreeIndex<cost_model::UnitCostModelLD<label::StringLabel>,_node::TreeIndexAll>
    .super_TEDAlgorithmTouzet<cost_model::UnitCostModelLD<label::StringLabel>,_node::TreeIndexAll>.
    td_.super_Matrix<double>.data_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    touzet_algorithm.
    super_TouzetBaselineTreeIndex<cost_model::UnitCostModelLD<label::StringLabel>,_node::TreeIndexAll>
    .super_TEDAlgorithmTouzet<cost_model::UnitCostModelLD<label::StringLabel>,_node::TreeIndexAll>.
    td_.super_Matrix<double>.data_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    touzet_algorithm.
    super_TouzetBaselineTreeIndex<cost_model::UnitCostModelLD<label::StringLabel>,_node::TreeIndexAll>
    .super_TEDAlgorithmTouzet<cost_model::UnitCostModelLD<label::StringLabel>,_node::TreeIndexAll>.
    fd_.super_Matrix<double>.data_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    touzet_algorithm.
    super_TouzetBaselineTreeIndex<cost_model::UnitCostModelLD<label::StringLabel>,_node::TreeIndexAll>
    .super_TEDAlgorithmTouzet<cost_model::UnitCostModelLD<label::StringLabel>,_node::TreeIndexAll>.
    fd_.super_Matrix<double>.data_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    touzet_algorithm.
    super_TouzetBaselineTreeIndex<cost_model::UnitCostModelLD<label::StringLabel>,_node::TreeIndexAll>
    .super_TEDAlgorithmTouzet<cost_model::UnitCostModelLD<label::StringLabel>,_node::TreeIndexAll>.
    fd_.super_Matrix<double>.data_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    ti1.super_PreLToTypeLeft.prel_to_type_left_.super__Bvector_base<std::allocator<bool>_>._M_impl.
    super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
    ti1.super_PreLToTypeLeft.prel_to_type_left_.super__Bvector_base<std::allocator<bool>_>._M_impl.
    super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_offset = 0;
    touzet_algorithm.
    super_TouzetBaselineTreeIndex<cost_model::UnitCostModelLD<label::StringLabel>,_node::TreeIndexAll>
    .super_TEDAlgorithmTouzet<cost_model::UnitCostModelLD<label::StringLabel>,_node::TreeIndexAll>.
    super_TEDAlgorithm<cost_model::UnitCostModelLD<label::StringLabel>,_node::TreeIndexAll>.
    _vptr_TEDAlgorithm = (_func_int **)&PTR_ted_0010dcf0;
    ti1.super_PreLToTypeRight.prel_to_type_right_.super__Bvector_base<std::allocator<bool>_>._M_impl
    .super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
    ti1.super_PreLToTypeRight.prel_to_type_right_.super__Bvector_base<std::allocator<bool>_>._M_impl
    .super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_offset = 0;
    local_d78 = 0;
    memset(&ti1.super_PreLToLabelId,0,0x27c);
    ti1.super_PreLToTypeLeft.prel_to_type_left_.super__Bvector_base<std::allocator<bool>_>._M_impl.
    super__Bvector_impl_data._M_end_of_storage = (_Bit_pointer)0x0;
    ti1.super_PreLToTypeRight.prel_to_type_right_.super__Bvector_base<std::allocator<bool>_>._M_impl
    .super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
    ti1.super_PreLToTypeRight.prel_to_type_right_.super__Bvector_base<std::allocator<bool>_>._M_impl
    .super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_offset = 0;
    memset(&ti1.super_PreLToTypeRight.prel_to_type_right_.super__Bvector_base<std::allocator<bool>_>
            ._M_impl.super__Bvector_impl_data._M_end_of_storage,0,0xb0);
    ti1.super_InvertedListLabelIdToPostL.inverted_list_label_id_to_postl_._M_h._M_bucket_count = 1;
    ti1.super_InvertedListLabelIdToPostL.inverted_list_label_id_to_postl_._M_h._M_before_begin.
    _M_nxt = (_Hash_node_base *)0x0;
    ti1.super_InvertedListLabelIdToPostL.inverted_list_label_id_to_postl_._M_h._M_element_count = 0;
    ti1.super_InvertedListLabelIdToPostL.inverted_list_label_id_to_postl_._M_h._M_rehash_policy.
    _M_max_load_factor = 1.0;
    ti1.super_InvertedListLabelIdToPostL.inverted_list_label_id_to_postl_._M_h._M_buckets =
         &ti1.super_InvertedListLabelIdToPostL.inverted_list_label_id_to_postl_._M_h.
          _M_single_bucket;
    memset(&ti1.super_InvertedListLabelIdToPostL.inverted_list_label_id_to_postl_._M_h.
            _M_rehash_policy._M_next_resize,0,0xa0);
    ti2.super_PreLToTypeLeft.prel_to_type_left_.super__Bvector_base<std::allocator<bool>_>._M_impl.
    super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
    ti2.super_PreLToTypeLeft.prel_to_type_left_.super__Bvector_base<std::allocator<bool>_>._M_impl.
    super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_offset = 0;
    ti2.super_PreLToTypeRight.prel_to_type_right_.super__Bvector_base<std::allocator<bool>_>._M_impl
    .super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
    ti2.super_PreLToTypeRight.prel_to_type_right_.super__Bvector_base<std::allocator<bool>_>._M_impl
    .super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_offset = 0;
    memset(&ti2.super_PreLToLabelId,0,0x27c);
    ti2.super_PreLToTypeLeft.prel_to_type_left_.super__Bvector_base<std::allocator<bool>_>._M_impl.
    super__Bvector_impl_data._M_end_of_storage = (_Bit_pointer)0x0;
    ti2.super_PreLToTypeRight.prel_to_type_right_.super__Bvector_base<std::allocator<bool>_>._M_impl
    .super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
    ti2.super_PreLToTypeRight.prel_to_type_right_.super__Bvector_base<std::allocator<bool>_>._M_impl
    .super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_offset = 0;
    memset(&ti2.super_PreLToTypeRight.prel_to_type_right_.super__Bvector_base<std::allocator<bool>_>
            ._M_impl.super__Bvector_impl_data._M_end_of_storage,0,0xb0);
    ti2.super_InvertedListLabelIdToPostL.inverted_list_label_id_to_postl_._M_h._M_bucket_count = 1;
    ti2.super_InvertedListLabelIdToPostL.inverted_list_label_id_to_postl_._M_h._M_before_begin.
    _M_nxt = (_Hash_node_base *)0x0;
    ti2.super_InvertedListLabelIdToPostL.inverted_list_label_id_to_postl_._M_h._M_element_count = 0;
    ti2.super_InvertedListLabelIdToPostL.inverted_list_label_id_to_postl_._M_h._M_rehash_policy.
    _M_max_load_factor = 1.0;
    ti2.super_InvertedListLabelIdToPostL.inverted_list_label_id_to_postl_._M_h._M_buckets =
         &ti2.super_InvertedListLabelIdToPostL.inverted_list_label_id_to_postl_._M_h.
          _M_single_bucket;
    memset(&ti2.super_InvertedListLabelIdToPostL.inverted_list_label_id_to_postl_._M_h.
            _M_rehash_policy._M_next_resize,0,0xa0);
    line._M_dataplus._M_p = (pointer)&line.field_2;
    line._M_string_length = 0;
    line.field_2._M_local_buf[0] = '\0';
    do {
      do {
        piVar3 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                           ((istream *)&test_cases_file,(string *)&line);
        if (((byte)piVar3[*(long *)(*(long *)piVar3 + -0x18) + 0x20] & 5) != 0) {
          local_d78 = 0;
          goto LAB_00102aee;
        }
      } while (*line._M_dataplus._M_p != '#');
      poVar4 = std::operator<<((ostream *)&std::cout,"--- TEST ---");
      std::endl<char,std::char_traits<char>>(poVar4);
      poVar4 = std::operator<<((ostream *)&std::cout,(string *)&line);
      std::endl<char,std::char_traits<char>>(poVar4);
      std::getline<char,std::char_traits<char>,std::allocator<char>>
                ((istream *)&test_cases_file,(string *)&line);
      std::__cxx11::string::string((string *)&source_tree,(string *)&line);
      std::getline<char,std::char_traits<char>,std::allocator<char>>
                ((istream *)&test_cases_file,(string *)&line);
      std::__cxx11::string::string((string *)&destination_tree,(string *)&line);
      std::getline<char,std::char_traits<char>,std::allocator<char>>
                ((istream *)&test_cases_file,(string *)&line);
      k = std::__cxx11::stoi(&line,(size_t *)0x0,10);
      std::getline<char,std::char_traits<char>,std::allocator<char>>
                ((istream *)&test_cases_file,(string *)&line);
      __val = std::__cxx11::stod(&line,(size_t *)0x0);
      parser::BracketNotationParser<label::StringLabel>::BracketNotationParser(&bnp);
      bVar2 = parser::BracketNotationParser<label::StringLabel>::validate_input(&bnp,&source_tree);
      if (bVar2) {
        bVar2 = parser::BracketNotationParser<label::StringLabel>::validate_input
                          (&bnp,&destination_tree);
        if (!bVar2) {
          poVar4 = std::operator<<((ostream *)&std::cerr,"Incorrect format of input tree: \'");
          psVar5 = &destination_tree;
          goto LAB_00102a6c;
        }
        parser::BracketNotationParser<label::StringLabel>::parse_single(&t1,&bnp,&source_tree);
        parser::BracketNotationParser<label::StringLabel>::parse_single(&t2,&bnp,&destination_tree);
        node::
        index_tree<node::TreeIndexAll,label::StringLabel,cost_model::UnitCostModelLD<label::StringLabel>>
                  (&ti1,&t1,&ld,&ucm);
        node::
        index_tree<node::TreeIndexAll,label::StringLabel,cost_model::UnitCostModelLD<label::StringLabel>>
                  (&ti2,&t2,&ld,&ucm);
        __val_00 = ted::
                   TouzetBaselineTreeIndex<cost_model::UnitCostModelLD<label::StringLabel>,_node::TreeIndexAll>
                   ::ted_k(&touzet_algorithm.
                            super_TouzetBaselineTreeIndex<cost_model::UnitCostModelLD<label::StringLabel>,_node::TreeIndexAll>
                           ,&ti1,&ti2,k);
        if ((__val_00 != __val) || (NAN(__val_00) || NAN(__val))) {
          poVar4 = std::operator<<((ostream *)&std::cerr,"Incorrect ted result:\n");
          std::__cxx11::to_string(&local_cd8,__val_00);
          poVar4 = std::operator<<(poVar4,(string *)&local_cd8);
          poVar4 = std::operator<<(poVar4,"\ninstead of\n");
          std::__cxx11::to_string(&local_cf8,__val);
          poVar4 = std::operator<<(poVar4,(string *)&local_cf8);
          std::endl<char,std::char_traits<char>>(poVar4);
          std::__cxx11::string::~string((string *)&local_cf8);
          std::__cxx11::string::~string((string *)&local_cd8);
          poVar4 = std::operator<<((ostream *)&std::cerr,"for input trees: ");
          poVar4 = std::operator<<(poVar4,(string *)&source_tree);
          poVar4 = std::operator<<(poVar4," | ");
          poVar4 = std::operator<<(poVar4,(string *)&destination_tree);
          std::endl<char,std::char_traits<char>>(poVar4);
          poVar4 = std::operator<<((ostream *)&std::cerr,"and k: ");
          poVar4 = (ostream *)std::ostream::operator<<(poVar4,k);
          std::endl<char,std::char_traits<char>>(poVar4);
          local_d78 = -1;
        }
        bVar2 = __val_00 == __val;
        node::Node<label::StringLabel>::~Node(&t2);
        node::Node<label::StringLabel>::~Node(&t1);
      }
      else {
        poVar4 = std::operator<<((ostream *)&std::cerr,"Incorrect format of input tree: \'");
        psVar5 = &source_tree;
LAB_00102a6c:
        poVar4 = std::operator<<(poVar4,(string *)psVar5);
        poVar4 = std::operator<<(poVar4,"\'. Is the number of opening and closing brackets equal?");
        std::endl<char,std::char_traits<char>>(poVar4);
        bVar2 = false;
        local_d78 = -1;
      }
      parser::BracketNotationParser<label::StringLabel>::~BracketNotationParser(&bnp);
      std::__cxx11::string::~string((string *)&destination_tree);
      std::__cxx11::string::~string((string *)&source_tree);
    } while (bVar2);
LAB_00102aee:
    std::__cxx11::string::~string((string *)&line);
    node::TreeIndexAll::~TreeIndexAll(&ti2);
    node::TreeIndexAll::~TreeIndexAll(&ti1);
    ted::TEDAlgorithmTouzet<cost_model::UnitCostModelLD<label::StringLabel>,_node::TreeIndexAll>::
    ~TEDAlgorithmTouzet((TEDAlgorithmTouzet<cost_model::UnitCostModelLD<label::StringLabel>,_node::TreeIndexAll>
                         *)&touzet_algorithm);
  }
  std::ifstream::~ifstream(&test_cases_file);
  label::LabelDictionary<label::StringLabel>::~LabelDictionary(&ld);
  return local_d78;
}

Assistant:

int main() {

  // Type aliases.
  using Label = label::StringLabel;
  using CostModel = cost_model::UnitCostModelLD<Label>;
  using LabelDictionary = label::LabelDictionary<Label>;
  
  // Initialise label dictionary - separate dictionary for each test tree
  // becuse it is easier to keep track of label ids.
  LabelDictionary ld;
  
  // Initialise cost model.
  CostModel ucm(ld);

  // Parse test cases from file.
  std::ifstream test_cases_file("touzet_ted_test_data.txt");
  if (!test_cases_file.is_open()) {
    std::cerr << "Error while opening file." << std::endl;
    return -1;
  }

  // Initialise Touzet's algorithm.
  ted::TouzetDepthPruningTruncatedTreeFixTreeIndex<CostModel, node::TreeIndexAll> touzet_algorithm(ucm);

  // Initialise two tree indexes.
  // Use TreeIndexAll that is a superset of all algorithms' indexes.
  node::TreeIndexAll ti1;
  node::TreeIndexAll ti2;

  for (std::string line; std::getline( test_cases_file, line);) {
    if (line[0] == '#') {
      std::cout << "--- TEST ---" << std::endl;
      std::cout << line << std::endl;
      
      std::getline(test_cases_file, line);
      std::string source_tree = line;
      std::getline(test_cases_file, line);
      std::string destination_tree = line;
      std::getline(test_cases_file, line);
      int k_value = std::stoi(line);
      
      std::getline(test_cases_file, line);
      double expected_result = std::stod(line);

      parser::BracketNotationParser<Label> bnp;

      // Validate test tree.
      if (!bnp.validate_input(source_tree)) {
        std::cerr << "Incorrect format of input tree: '" << source_tree << "'. Is the number of opening and closing brackets equal?" << std::endl;
        return -1;
      }
      // Validate test tree.
      if (!bnp.validate_input(destination_tree)) {
        std::cerr << "Incorrect format of input tree: '" << destination_tree << "'. Is the number of opening and closing brackets equal?" << std::endl;
        return -1;
      }
      // Parse test tree.
      node::Node<Label> t1 = bnp.parse_single(source_tree);
      node::Node<Label> t2 = bnp.parse_single(destination_tree);

      // Index input trees.
      node::index_tree(ti1, t1, ld, ucm);
      node::index_tree(ti2, t2, ld, ucm);

      // Execute the algorithm and get the result.
      double computed_result = touzet_algorithm.ted_k(ti1, ti2, k_value);

      if (computed_result != expected_result) {
        std::cerr << "Incorrect ted result:\n" << std::to_string(computed_result) << "\ninstead of\n" << std::to_string(expected_result) << std::endl;
        std::cerr << "for input trees: " << source_tree << " | " << destination_tree << std::endl;
        std::cerr << "and k: " << k_value << std::endl;
        return -1;
      }
    }
  }

  return 0;
}